

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

ForRangeStmt * __thiscall parser::Parser::parseForIntRangeStatement(Parser *this)

{
  pointer pcVar1;
  ForRangeStmt *pFVar2;
  Identifier *pIVar3;
  RangeExpr *pRVar4;
  BlockStmt *pBVar5;
  ostringstream message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  undefined **local_208;
  TokenType local_200;
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  undefined **local_1d8;
  TokenType local_1d0;
  long *local_1c8;
  long local_1c0;
  long local_1b8 [2];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  pFVar2 = (ForRangeStmt *)operator_new(0x58);
  local_1d8 = &PTR__Token_001788a0;
  local_1d0 = (this->curToken).Type;
  pcVar1 = (this->curToken).Literal._M_dataplus._M_p;
  local_1c8 = local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar1,pcVar1 + (this->curToken).Literal._M_string_length);
  (pFVar2->super_Stmt).super_Node.lineno = this->l->line;
  (pFVar2->super_Stmt).super_Node.type_value = ForStmtType;
  (pFVar2->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__ForRangeStmt_00179850;
  (pFVar2->tok)._vptr_Token = (_func_int **)&PTR__Token_001788a0;
  (pFVar2->tok).Type = local_1d0;
  (pFVar2->tok).Literal._M_dataplus._M_p = (pointer)&(pFVar2->tok).Literal.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(pFVar2->tok).Literal,local_1c8,local_1c0 + (long)local_1c8);
  local_1d8 = &PTR__Token_001788a0;
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if ((this->peekToken).Type == ID) {
    nextToken(this);
    pIVar3 = (Identifier *)operator_new(0x48);
    local_208 = &PTR__Token_001788a0;
    local_200 = (this->curToken).Type;
    pcVar1 = (this->curToken).Literal._M_dataplus._M_p;
    local_1f8 = local_1e8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar1,pcVar1 + (this->curToken).Literal._M_string_length);
    (pIVar3->super_Expr).super_Node.lineno = this->l->line;
    (pIVar3->super_Expr).super_Node.type_value = IdentifierType;
    (pIVar3->super_Expr).super_Node._vptr_Node = (_func_int **)&PTR__Identifier_00179190;
    (pIVar3->tok)._vptr_Token = (_func_int **)&PTR__Token_001788a0;
    (pIVar3->tok).Type = local_200;
    (pIVar3->tok).Literal._M_dataplus._M_p = (pointer)&(pIVar3->tok).Literal.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(pIVar3->tok).Literal,local_1f8,local_1f0 + (long)local_1f8);
    pIVar3->value = (Expr *)0x0;
    pFVar2->target = pIVar3;
    local_208 = &PTR__Token_001788a0;
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    if ((this->peekToken).Type == IN) {
      nextToken(this);
      pRVar4 = parseIntRangeExpression(this);
      pFVar2->iter = pRVar4;
      pBVar5 = parseBlockStatement(this);
      pFVar2->body = pBVar5;
      nextToken(this);
      goto LAB_001215b3;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"expected \'in\'",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," found ",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(this->peekToken).Literal._M_dataplus._M_p,
               (this->peekToken).Literal._M_string_length);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors,
               &local_228);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"expected an identifier",0x16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," found ",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(this->peekToken).Literal._M_dataplus._M_p,
               (this->peekToken).Literal._M_string_length);
    std::__cxx11::stringbuf::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors,
               &local_228);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  (*(pFVar2->super_Stmt).super_Node._vptr_Node[1])(pFVar2);
  pFVar2 = (ForRangeStmt *)0x0;
LAB_001215b3:
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return pFVar2;
}

Assistant:

ForRangeStmt* Parser::parseForIntRangeStatement()
{
    ForRangeStmt* stmt(new ForRangeStmt(curToken, l->line));
    std::ostringstream message;
    if(!expectPeek(TokenType::ID)){
        message << "expected an identifier"
             << " found " << peekToken.Literal;
        errors.push_back(message.str());
        delete stmt;
        return nullptr;
    }

    stmt->target = new Identifier(curToken, l->line);
    if(!expectPeek(TokenType::IN)){
        message << "expected 'in'"
             << " found " << peekToken.Literal;
        errors.push_back(message.str());
        delete stmt;
        return nullptr;
    }
    stmt->iter = parseIntRangeExpression();
    stmt->body = parseBlockStatement();
    nextToken();
    return stmt;
}